

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InlineCache.h
# Opt level: O0

void __thiscall
Js::InlineCache::
OutputPropertyValueAndOperationInfo<false,false,true,(Js::CacheType)1,(Js::SlotType)2>
          (InlineCache *this,Var instance,RecyclableObject *propertyObject,PropertyId propertyId,
          Var *propertyValue,ScriptContext *requestContext,PropertyCacheOperationInfo *operationInfo
          )

{
  code *pcVar1;
  bool bVar2;
  RecyclableObject *this_00;
  ScriptContext *pSVar3;
  undefined4 *puVar4;
  ScriptContext *requestContext_local;
  Var *propertyValue_local;
  PropertyId propertyId_local;
  RecyclableObject *propertyObject_local;
  Var instance_local;
  InlineCache *this_local;
  
  this_00 = GetSourceObjectForScriptContext<(Js::CacheType)1>(this,propertyObject);
  pSVar3 = RecyclableObject::GetScriptContext(this_00);
  if (pSVar3 != requestContext) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/InlineCache.h"
                                ,0x183,
                                "(this->GetSourceObjectForScriptContext<cacheType>(propertyObject)->GetScriptContext() == requestContext)"
                                ,
                                "this->GetSourceObjectForScriptContext<cacheType>(propertyObject)->GetScriptContext() == requestContext"
                               );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  OutputPropertyValue<false,_false,_(Js::CacheType)1,_(Js::SlotType)2>::impl
            (this,instance,propertyObject,propertyId,propertyValue,requestContext);
  OutputOperationInfo<true>(operationInfo,CacheType_Local,SlotType_Aux);
  return;
}

Assistant:

void OutputPropertyValueAndOperationInfo(
            Var const instance,
            RecyclableObject *const propertyObject,
            const PropertyId propertyId,
            Var *const propertyValue,
            ScriptContext *const requestContext,
            PropertyCacheOperationInfo *const operationInfo)
        {
            Assert(this->GetSourceObjectForScriptContext<cacheType>(propertyObject)->GetScriptContext() == requestContext); // we never cache a type from another script context
            OutputPropertyValue<OutputExistence, IsMissing, cacheType, slotType>::impl(this, instance, propertyObject, propertyId, propertyValue, requestContext);
            OutputOperationInfo<ReturnOperationInfo>(operationInfo, cacheType, slotType);
        }